

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

optional<common::ConfigError> *
common::InitConfig(optional<common::ConfigError> *__return_storage_ptr__,ArgsManager *args,
                  SettingsAbortFn settings_abort_fn)

{
  long lVar1;
  string_view source_file;
  string arg;
  string original;
  bool bVar2;
  char cVar3;
  bool bVar4;
  ChainType chain;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bilingual_str *strDefault;
  string *psVar7;
  function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_RDX;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  allocator<char> local_369;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_368 [3];
  string local_338;
  string error_1;
  string config_source;
  string cli_config_path;
  path local_2b8;
  path base_config_path;
  path local_268;
  path net_path;
  path local_218;
  path base_path;
  string error;
  undefined1 local_1a8 [32];
  path orig_config_path;
  path orig_datadir_path;
  bilingual_str local_138;
  string log_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  undefined2 local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  details;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckDataDirOption(args);
  if (!bVar2) {
    log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffff00000000;
    _(&local_138,(ConstevalStringLiteral)0x71b6e7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&orig_config_path,"-datadir",(allocator<char> *)&net_path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base_path,"",(allocator<char> *)&base_config_path);
    psVar7 = (string *)&base_path;
    ArgsManager::GetArg((string *)&orig_datadir_path,args,(string *)&orig_config_path,psVar7);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&log_msg._M_string_length,(tinyformat *)&local_138,
               (bilingual_str *)&orig_datadir_path,psVar7);
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::optional<common::ConfigError>::optional<common::ConfigError,_true>
              (__return_storage_ptr__,(ConfigError *)&log_msg);
    ConfigError::~ConfigError((ConfigError *)&log_msg);
    std::__cxx11::string::~string((string *)&orig_datadir_path);
    std::__cxx11::string::~string((string *)&base_path);
    std::__cxx11::string::~string((string *)&orig_config_path);
    bilingual_str::~bilingual_str(&local_138);
    goto LAB_00575aa2;
  }
  ArgsManager::GetDataDirBase(&orig_datadir_path,args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"-conf",(allocator<char> *)&base_path);
  fs::path::path((path *)&local_138,"bitcoin.conf");
  arg._M_string_length = in_stack_fffffffffffffc70;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffc78;
  arg.field_2._8_4_ = in_stack_fffffffffffffc80;
  arg.field_2._12_4_ = in_stack_fffffffffffffc84;
  ArgsManager::GetPathArg((path *)&log_msg,args,arg,(path *)local_1a8);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AbsPathForConfigVal(&orig_config_path,args,(path *)&log_msg,false);
  std::filesystem::__cxx11::path::~path((path *)&log_msg);
  std::filesystem::__cxx11::path::~path((path *)&local_138);
  std::__cxx11::string::~string((string *)local_1a8);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar2 = ArgsManager::ReadConfigFiles(args,&error,true);
  if (!bVar2) {
    log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffff00000000;
    _(&local_138,(ConstevalStringLiteral)0x71b715);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&log_msg._M_string_length,(tinyformat *)&local_138,
               (bilingual_str *)&error,pbVar6);
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::optional<common::ConfigError>::optional<common::ConfigError,_true>
              (__return_storage_ptr__,(ConfigError *)&log_msg);
    ConfigError::~ConfigError((ConfigError *)&log_msg);
    bilingual_str::~bilingual_str(&local_138);
    std::__cxx11::string::~string((string *)&error);
    std::filesystem::__cxx11::path::~path(&orig_config_path.super_path);
    std::filesystem::__cxx11::path::~path(&orig_datadir_path.super_path);
    goto LAB_00575aa2;
  }
  chain = ArgsManager::GetChainType(args);
  SelectParams(chain);
  ArgsManager::GetDataDirBase(&base_path,args);
  bVar2 = std::filesystem::exists(&base_path.super_path);
  if (!bVar2) {
    std::filesystem::__cxx11::path::path(&local_218,&base_path.super_path);
    fs::operator/((path *)&log_msg,(path *)&local_218,"wallets");
    fs::create_directories((path *)&log_msg);
    std::filesystem::__cxx11::path::~path((path *)&log_msg);
    std::filesystem::__cxx11::path::~path(&local_218);
  }
  ArgsManager::GetDataDirNet(&net_path,args);
  bVar2 = std::filesystem::exists(&net_path.super_path);
  if (!bVar2) {
    std::filesystem::__cxx11::path::path(&local_268,&net_path.super_path);
    fs::operator/((path *)&log_msg,(path *)&local_268,"wallets");
    fs::create_directories((path *)&log_msg);
    std::filesystem::__cxx11::path::~path((path *)&log_msg);
    std::filesystem::__cxx11::path::~path(&local_268);
  }
  std::filesystem::__cxx11::path::path(&local_2b8,&base_path.super_path);
  fs::operator/(&base_config_path,(path *)&local_2b8,"bitcoin.conf");
  std::filesystem::__cxx11::path::~path(&local_2b8);
  bVar2 = std::filesystem::exists(&base_config_path.super_path);
  if (bVar2) {
    cVar3 = std::filesystem::equivalent(&orig_config_path.super_path,&base_config_path.super_path);
    if (cVar3 != '\0') goto LAB_005758a5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-conf",(allocator<char> *)&details);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"",(allocator<char> *)&local_78);
    strDefault = &local_138;
    ArgsManager::GetArg(&cli_config_path,args,&log_msg,&strDefault->original);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&log_msg);
    if (cli_config_path._M_string_length == 0) {
      std::filesystem::__cxx11::path::string(&log_msg,&orig_datadir_path.super_path);
      local_138.original._M_string_length =
           CONCAT62(local_138.original._M_string_length._2_6_,0x2622);
      local_138.original._M_dataplus._M_p = (pointer)&log_msg;
      tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                (&config_source,(tinyformat *)"data directory %s",(char *)&local_138,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)strDefault);
    }
    else {
      std::operator+(&log_msg,"-conf=",&cli_config_path);
      details.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT62(details.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._2_6_,0x2622);
      details.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &log_msg;
      tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                (&config_source,(tinyformat *)"command line argument %s",(char *)&details,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)strDefault);
    }
    std::__cxx11::string::~string((string *)&log_msg);
    std::filesystem::__cxx11::path::string(&log_msg,&base_path.super_path);
    local_70 = 0x2622;
    local_78 = &log_msg;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"bitcoin.conf",&local_369);
    local_98._M_string_length._0_2_ = 0x2622;
    local_98._M_dataplus._M_p = (pointer)&local_138;
    std::filesystem::__cxx11::path::string((string *)&details,&orig_config_path.super_path);
    local_368[0]._M_delim = '\"';
    local_368[0]._M_escape = '&';
    pbVar6 = &local_98;
    local_368[0]._M_string = (string *)&details;
    tinyformat::
    format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__cxx11::string>
              (&error_1,(tinyformat *)
                        "Data directory %1$s contains a %2$s file which is ignored, because a different configuration file %3$s from %4$s is being used instead. Possible ways to address this would be to:\n- Delete or rename the %2$s file in data directory %1$s.\n- Change datadir= or conf= options to specify one configuration file, not two, and use includeconf= to include any other configuration files.\n- Set allowignoredconf=1 option to treat this condition as a warning, not an error."
               ,(char *)&local_78,
               (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)pbVar6,local_368,
               (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)&config_source,in_stack_fffffffffffffc68);
    std::__cxx11::string::~string((string *)&details);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&log_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"-allowignoredconf",(allocator<char> *)&local_138);
    bVar2 = ArgsManager::GetBoolArg(args,&log_msg,false);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar2) {
      pLVar5 = LogInstance();
      bVar4 = BCLog::Logger::Enabled(pLVar5);
      if (bVar4) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string>
                  (&local_138.original,(tinyformat *)"Warning: %s\n",(char *)&error_1,pbVar6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_138.original);
        std::__cxx11::string::~string((string *)&local_138);
        pLVar5 = LogInstance();
        local_138.original._M_dataplus._M_p = (pointer)0x58;
        local_138.original._M_string_length = 0x71b945;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/init.cpp"
        ;
        source_file._M_len = 0x58;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "InitConfig";
        logging_function._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x55,ALL,Info);
        psVar7 = &log_msg;
        goto LAB_00575870;
      }
    }
    else {
      log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffff00000000;
      std::__cxx11::string::string((string *)&local_338,&error_1);
      original._M_string_length = in_stack_fffffffffffffc70;
      original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
      original.field_2._M_allocated_capacity = in_stack_fffffffffffffc78;
      original.field_2._8_4_ = in_stack_fffffffffffffc80;
      original.field_2._12_4_ = in_stack_fffffffffffffc84;
      Untranslated((bilingual_str *)&log_msg._M_string_length,original);
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::optional<common::ConfigError>::optional<common::ConfigError,_true>
                (__return_storage_ptr__,(ConfigError *)&log_msg);
      ConfigError::~ConfigError((ConfigError *)&log_msg);
      psVar7 = &local_338;
LAB_00575870:
      std::__cxx11::string::~string((string *)psVar7);
    }
    std::__cxx11::string::~string((string *)&error_1);
    std::__cxx11::string::~string((string *)&config_source);
    std::__cxx11::string::~string((string *)&cli_config_path);
    if (bVar2) goto LAB_005758a5;
LAB_00575a49:
    bVar2 = false;
  }
  else {
LAB_005758a5:
    bVar4 = ArgsManager::GetSettingsPath(args,(path *)0x0,false,false);
    bVar2 = true;
    if (bVar4) {
      details.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      details.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      details.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ArgsManager::ReadSettingsFile(args,&details);
      if (bVar4) {
LAB_005759a3:
        bVar4 = ArgsManager::WriteSettingsFile(args,&details,false);
        if (bVar4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&details);
          goto LAB_00575a4b;
        }
        _(&local_138,(ConstevalStringLiteral)0x71b9cb);
        log_msg._M_dataplus._M_p._0_4_ = 1;
        bilingual_str::bilingual_str((bilingual_str *)&log_msg._M_string_length,&local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_b0,&details);
      }
      else {
        _(&local_138,(ConstevalStringLiteral)0x71b9ab);
        if ((in_RDX->super__Function_base)._M_manager == (_Manager_type)0x0) {
          log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffff00000000;
          bilingual_str::bilingual_str((bilingual_str *)&log_msg._M_string_length,&local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_b0,&details);
        }
        else {
          bVar4 = std::
                  function<bool_(const_bilingual_str_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                  ::operator()(in_RDX,&local_138,&details);
          if (!bVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&details);
            bilingual_str::~bilingual_str(&local_138);
            goto LAB_005759a3;
          }
          log_msg._M_dataplus._M_p._0_4_ = 2;
          bilingual_str::bilingual_str((bilingual_str *)&log_msg._M_string_length,&local_138);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_b0,&details);
        }
      }
      std::optional<common::ConfigError>::optional<common::ConfigError,_true>
                (__return_storage_ptr__,(ConfigError *)&log_msg);
      ConfigError::~ConfigError((ConfigError *)&log_msg);
      bilingual_str::~bilingual_str(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&details);
      goto LAB_00575a49;
    }
  }
LAB_00575a4b:
  std::filesystem::__cxx11::path::~path(&base_config_path.super_path);
  std::filesystem::__cxx11::path::~path(&net_path.super_path);
  std::filesystem::__cxx11::path::~path(&base_path.super_path);
  std::__cxx11::string::~string((string *)&error);
  std::filesystem::__cxx11::path::~path(&orig_config_path.super_path);
  std::filesystem::__cxx11::path::~path(&orig_datadir_path.super_path);
  if (bVar2) {
    (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>)._M_payload.
    super__Optional_payload<common::ConfigError,_true,_false,_false>.
    super__Optional_payload_base<common::ConfigError>._M_engaged = false;
  }
LAB_00575aa2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ConfigError> InitConfig(ArgsManager& args, SettingsAbortFn settings_abort_fn)
{
    try {
        if (!CheckDataDirOption(args)) {
            return ConfigError{ConfigStatus::FAILED, strprintf(_("Specified data directory \"%s\" does not exist."), args.GetArg("-datadir", ""))};
        }

        // Record original datadir and config paths before parsing the config
        // file. It is possible for the config file to contain a datadir= line
        // that changes the datadir path after it is parsed. This is useful for
        // CLI tools to let them use a different data storage location without
        // needing to pass it every time on the command line. (It is not
        // possible for the config file to cause another configuration to be
        // used, though. Specifying a conf= option in the config file causes a
        // parse error, and specifying a datadir= location containing another
        // bitcoin.conf file just ignores the other file.)
        const fs::path orig_datadir_path{args.GetDataDirBase()};
        const fs::path orig_config_path{AbsPathForConfigVal(args, args.GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false)};

        std::string error;
        if (!args.ReadConfigFiles(error, true)) {
            return ConfigError{ConfigStatus::FAILED, strprintf(_("Error reading configuration file: %s"), error)};
        }

        // Check for chain settings (Params() calls are only valid after this clause)
        SelectParams(args.GetChainType());

        // Create datadir if it does not exist.
        const auto base_path{args.GetDataDirBase()};
        if (!fs::exists(base_path)) {
            // When creating a *new* datadir, also create a "wallets" subdirectory,
            // whether or not the wallet is enabled now, so if the wallet is enabled
            // in the future, it will use the "wallets" subdirectory for creating
            // and listing wallets, rather than the top-level directory where
            // wallets could be mixed up with other files. For backwards
            // compatibility, wallet code will use the "wallets" subdirectory only
            // if it already exists, but never create it itself. There is discussion
            // in https://github.com/bitcoin/bitcoin/issues/16220 about ways to
            // change wallet code so it would no longer be necessary to create
            // "wallets" subdirectories here.
            fs::create_directories(base_path / "wallets");
        }
        const auto net_path{args.GetDataDirNet()};
        if (!fs::exists(net_path)) {
            fs::create_directories(net_path / "wallets");
        }

        // Show an error or warning if there is a bitcoin.conf file in the
        // datadir that is being ignored.
        const fs::path base_config_path = base_path / BITCOIN_CONF_FILENAME;
        if (fs::exists(base_config_path) && !fs::equivalent(orig_config_path, base_config_path)) {
            const std::string cli_config_path = args.GetArg("-conf", "");
            const std::string config_source = cli_config_path.empty()
                ? strprintf("data directory %s", fs::quoted(fs::PathToString(orig_datadir_path)))
                : strprintf("command line argument %s", fs::quoted("-conf=" + cli_config_path));
            const std::string error = strprintf(
                "Data directory %1$s contains a %2$s file which is ignored, because a different configuration file "
                "%3$s from %4$s is being used instead. Possible ways to address this would be to:\n"
                "- Delete or rename the %2$s file in data directory %1$s.\n"
                "- Change datadir= or conf= options to specify one configuration file, not two, and use "
                "includeconf= to include any other configuration files.\n"
                "- Set allowignoredconf=1 option to treat this condition as a warning, not an error.",
                fs::quoted(fs::PathToString(base_path)),
                fs::quoted(BITCOIN_CONF_FILENAME),
                fs::quoted(fs::PathToString(orig_config_path)),
                config_source);
            if (args.GetBoolArg("-allowignoredconf", false)) {
                LogPrintf("Warning: %s\n", error);
            } else {
                return ConfigError{ConfigStatus::FAILED, Untranslated(error)};
            }
        }

        // Create settings.json if -nosettings was not specified.
        if (args.GetSettingsPath()) {
            std::vector<std::string> details;
            if (!args.ReadSettingsFile(&details)) {
                const bilingual_str& message = _("Settings file could not be read");
                if (!settings_abort_fn) {
                    return ConfigError{ConfigStatus::FAILED, message, details};
                } else if (settings_abort_fn(message, details)) {
                    return ConfigError{ConfigStatus::ABORTED, message, details};
                } else {
                    details.clear(); // User chose to ignore the error and proceed.
                }
            }
            if (!args.WriteSettingsFile(&details)) {
                const bilingual_str& message = _("Settings file could not be written");
                return ConfigError{ConfigStatus::FAILED_WRITE, message, details};
            }
        }
    } catch (const std::exception& e) {
        return ConfigError{ConfigStatus::FAILED, Untranslated(e.what())};
    }
    return {};
}